

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_osd_decode.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  unsigned_long_long uVar5;
  reference j;
  ostream *poVar6;
  ostream *poVar7;
  ostream *poVar8;
  mod2sparse *pmVar9;
  ulong uVar10;
  void *pvVar11;
  char *__s;
  long in_RSI;
  undefined4 uVar12;
  double dVar13;
  undefined4 uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ofstream output_file;
  int bit_no;
  unsigned_long_long run_count;
  double bp_ler;
  double osd0_ler;
  double osdw_ler;
  bool zero_error;
  bool logical_error;
  unsigned_long_long osdw_success_count;
  unsigned_long_long osd0_success_count;
  unsigned_long_long bp_success_count;
  unsigned_long_long bp_converge_count;
  char *bit_syndrome;
  char *osdw_decoding;
  char *osd_decoding;
  char *bp_decoding;
  char *bit_error;
  double *soft_decisions;
  bp_osd hx_bp_osd;
  int hz_n;
  int hz_m;
  mod2sparse *hz;
  int lx_n;
  int lx_k;
  mod2sparse *lx;
  int hx_n;
  int hx_m;
  mod2sparse *hx;
  stringstream output_filename;
  string label;
  string p_label;
  int bp_method_i;
  string bp_method;
  int osd_method_i;
  string osd_method;
  string logical_check_method;
  unsigned_long_long target_runs;
  int max_iter;
  int osd_order;
  double bit_error_rate;
  unsigned_long_long ui;
  MTRand r;
  int random_seed;
  json output;
  json json_input;
  ifstream json_input_file;
  int elapsed_seconds;
  timing time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffd858;
  timing *in_stack_ffffffffffffd860;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd868;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd870;
  ostream *in_stack_ffffffffffffd878;
  mod2sparse *in_stack_ffffffffffffd880;
  bp_osd *in_stack_ffffffffffffd888;
  mod2sparse *in_stack_ffffffffffffd890;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffd898;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffd8a0;
  undefined8 in_stack_ffffffffffffd8e8;
  double in_stack_ffffffffffffd8f0;
  string *in_stack_ffffffffffffd8f8;
  string *in_stack_ffffffffffffd900;
  mod2sparse *in_stack_ffffffffffffd908;
  bp_osd *in_stack_ffffffffffffd910;
  char *in_stack_ffffffffffffd918;
  reference in_stack_ffffffffffffd920;
  undefined4 in_stack_ffffffffffffd978;
  undefined4 in_stack_ffffffffffffd97c;
  undefined4 in_stack_ffffffffffffd980;
  undefined4 in_stack_ffffffffffffd984;
  undefined8 in_stack_ffffffffffffdb28;
  error_handler_t error_handler;
  undefined8 in_stack_ffffffffffffdb30;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *in_stack_ffffffffffffdb38;
  string local_2348 [32];
  string local_2328 [32];
  ostream local_2308 [512];
  char *local_2108;
  double local_20f0;
  char local_2098 [68];
  int local_2054;
  ulong local_2050;
  double local_2048;
  double local_2040;
  double local_2038;
  byte local_202a;
  bool local_2029;
  long local_2028;
  long local_2020;
  long local_2018;
  long local_2010;
  void *local_2008;
  char *local_2000;
  void *local_1ff8;
  void *local_1ff0;
  void *local_1fe8;
  void *local_1fe0;
  int *local_1f80;
  int local_1f1c;
  int local_1f18;
  allocator local_1f11;
  string local_1f10 [39];
  allocator local_1ee9;
  string local_1ee8 [64];
  string local_1ea8 [32];
  mod2sparse *local_1e88;
  int local_1e5c;
  int local_1e58;
  allocator local_1e51;
  string local_1e50 [39];
  allocator local_1e29;
  string local_1e28 [64];
  string local_1de8 [32];
  mod2sparse *local_1dc8;
  int local_1d9c;
  int local_1d98;
  allocator local_1d91;
  string local_1d90 [39];
  allocator local_1d69;
  string local_1d68 [64];
  string local_1d28 [32];
  mod2sparse *local_1d08;
  string local_1d00 [32];
  stringstream local_1ce0 [16];
  ostream local_1cd0 [376];
  string local_1b58 [38];
  undefined1 local_1b32;
  undefined1 local_1b31;
  undefined8 local_1b30;
  undefined8 local_1b28;
  ostream local_1b20 [48];
  undefined4 local_1af0;
  allocator local_1ae9;
  string local_1ae8 [39];
  allocator local_1ac1;
  string local_1ac0 [64];
  string local_1a80 [52];
  undefined4 local_1a4c;
  undefined4 local_1a38;
  allocator local_1a31;
  string local_1a30 [39];
  allocator local_1a09;
  string local_1a08 [64];
  string local_19c8 [39];
  allocator local_19a1;
  string local_19a0 [39];
  allocator local_1979;
  string local_1978 [64];
  string local_1938 [39];
  allocator local_1911;
  string local_1910 [39];
  allocator local_18e9;
  string local_18e8 [64];
  unsigned_long_long local_18a8;
  allocator local_1899;
  string local_1898 [39];
  allocator local_1871;
  string local_1870 [64];
  int local_1830;
  allocator local_1829;
  string local_1828 [39];
  allocator local_1801;
  string local_1800 [64];
  int local_17c0;
  allocator local_17b9;
  string local_17b8 [39];
  allocator local_1791;
  string local_1790 [64];
  double local_1750;
  ulonglong local_1738;
  unsigned_long_long in_stack_ffffffffffffebf0;
  allocator local_391;
  string local_390 [39];
  allocator local_369;
  string local_368 [68];
  int local_324;
  string local_300 [64];
  undefined1 local_2c0 [524];
  int local_b4;
  char *local_20;
  int local_18;
  long local_10;
  int local_4;
  undefined1 auVar14 [16];
  
  error_handler = (error_handler_t)((ulong)in_stack_ffffffffffffdb28 >> 0x20);
  local_4 = 0;
  if (*(long *)(in_RSI + 8) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "ERROR: Please provide a location for the input directory");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    exit(0x16);
  }
  if (*(long *)(in_RSI + 0x10) != 0) {
    local_10 = in_RSI;
    timing::timing(in_stack_ffffffffffffd860);
    poVar4 = std::operator<<((ostream *)&std::cout,"Start time: ");
    poVar4 = std::operator<<(poVar4,local_20);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Input file: ");
    poVar4 = std::operator<<(poVar4,*(char **)(local_10 + 8));
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    dVar13 = timing::elapsed_time_seconds((timing *)in_stack_ffffffffffffd870._M_current);
    local_b4 = (int)dVar13;
    std::ifstream::ifstream(local_2c0,*(char **)(local_10 + 8),_S_in);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd860,in_stack_ffffffffffffd858);
    nlohmann::operator>>
              ((istream *)CONCAT44(in_stack_ffffffffffffd984,in_stack_ffffffffffffd980),
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)CONCAT44(in_stack_ffffffffffffd97c,in_stack_ffffffffffffd978));
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::dump(in_stack_ffffffffffffdb38,(int)((ulong)in_stack_ffffffffffffdb30 >> 0x20),
           (char)((ulong)in_stack_ffffffffffffdb30 >> 0x18),
           SUB81((ulong)in_stack_ffffffffffffdb30 >> 0x10,0),error_handler);
    poVar4 = std::operator<<((ostream *)&std::cout,local_300);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_300);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<char_*&,_char_*,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(char **)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_368,"input_seed",&local_369);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_390,"0",&local_391);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    iVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_int<int,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x145dd7);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_390);
    std::allocator<char>::~allocator((allocator<char> *)&local_391);
    std::__cxx11::string::~string(local_368);
    std::allocator<char>::~allocator((allocator<char> *)&local_369);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_324 = iVar3;
    setup_mtwister_rng(in_stack_ffffffffffffebf0);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<char_*&,_char_*,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(char **)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_1738 = (ulonglong)(local_18 + local_324);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<unsigned_long_long_&,_unsigned_long_long,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(unsigned_long_long *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1790,"bit_error_rate",&local_1791);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_17b8,"0",&local_17b9);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    dVar13 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             ::operator_double<double,_0>
                       ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)0x145fda);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_17b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_17b9);
    std::__cxx11::string::~string(local_1790);
    std::allocator<char>::~allocator((allocator<char> *)&local_1791);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_1750 = dVar13;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1800,"osd_order",&local_1801);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1828,"0",&local_1829);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    iVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_int<int,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x1460f6);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1828);
    std::allocator<char>::~allocator((allocator<char> *)&local_1829);
    std::__cxx11::string::~string(local_1800);
    std::allocator<char>::~allocator((allocator<char> *)&local_1801);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_17c0 = iVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1870,"max_iter",&local_1871);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1898,"0",&local_1899);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    iVar3 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_int<int,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x14620c);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1898);
    std::allocator<char>::~allocator((allocator<char> *)&local_1899);
    std::__cxx11::string::~string(local_1870);
    std::allocator<char>::~allocator((allocator<char> *)&local_1871);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_1830 = iVar3;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_18e8,"target_runs",&local_18e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1910,"0",&local_1911);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    uVar5 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::operator_unsigned_long_long<unsigned_long_long,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)0x146322);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1910);
    std::allocator<char>::~allocator((allocator<char> *)&local_1911);
    std::__cxx11::string::~string(local_18e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_18e9);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_18a8 = uVar5;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1978,"logical_check_method",&local_1979);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19a0,"lx",&local_19a1);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_19a0);
    std::allocator<char>::~allocator((allocator<char> *)&local_19a1);
    std::__cxx11::string::~string(local_1978);
    std::allocator<char>::~allocator((allocator<char> *)&local_1979);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
    if ((!bVar2) &&
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858),
       !bVar2)) {
      poVar4 = std::operator<<((ostream *)&std::cout,
                               "ERROR: Please select a valid method for verifying the recovered error. `lx\' or `hz\'."
                              );
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      exit(0x16);
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a08,"osd_method",&local_1a09);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1a30,"0",&local_1a31);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a31);
    std::__cxx11::string::~string(local_1a08);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a09);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_1a38 = 0xffffffff;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
    if ((bVar2) ||
       (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858), bVar2
       )) {
      local_1a38 = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
      if ((bVar2) ||
         (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858),
         bVar2)) {
        local_1a38 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
        if (bVar2) {
          local_1a38 = 2;
          local_1a4c = 0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json<int,_int,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd870._M_current,
                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd868._M_current);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                         *)in_stack_ffffffffffffd860);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cout,"ERROR: Invalid OSD method: ");
            poVar4 = std::operator<<(poVar4,local_19c8);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            exit(0x16);
          }
          local_1a38 = 3;
        }
      }
    }
    if (local_17c0 == 0) {
      std::__cxx11::string::operator=(local_19c8,"osd_0");
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd860,in_stack_ffffffffffffd858);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd870._M_current,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd868._M_current);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      local_1a38 = 2;
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ac0,"bp_method",&local_1ac1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1ae8,"min_sum",&local_1ae9);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1ae8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ae9);
    std::__cxx11::string::~string(local_1ac0);
    std::allocator<char>::~allocator((allocator<char> *)&local_1ac1);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_1af0 = 0xffffffff;
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
    if (bVar2) {
      local_1af0 = 0;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
      if (bVar2) {
        local_1af0 = 1;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
        if (bVar2) {
          local_1af0 = 2;
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
          if (!bVar2) {
            poVar4 = std::operator<<((ostream *)&std::cout,"ERROR: Invalid BP method: ");
            poVar4 = std::operator<<(poVar4,local_1a80);
            std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
            exit(0x16);
          }
          local_1af0 = 3;
        }
      }
    }
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::to_string((double)in_stack_ffffffffffffd868._M_current);
    poVar4 = local_1b20;
    local_1b28 = std::__cxx11::string::begin();
    local_1b30 = std::__cxx11::string::end();
    local_1b31 = 0x2e;
    local_1b32 = 0x5f;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (in_stack_ffffffffffffd870,in_stack_ffffffffffffd868,(char *)in_stack_ffffffffffffd860
               ,(char *)in_stack_ffffffffffffd858);
    j = nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd858);
    std::__cxx11::stringstream::stringstream(local_1ce0);
    poVar6 = std::operator<<(local_1cd0,*(char **)(local_10 + 0x10));
    poVar7 = std::operator<<(poVar6,"/");
    poVar8 = std::operator<<(poVar7,local_1b58);
    poVar8 = std::operator<<(poVar8,";p:");
    poVar8 = std::operator<<(poVar8,(string *)local_1b20);
    poVar8 = std::operator<<(poVar8,";ui:");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_1738);
    std::operator<<(poVar8,".json");
    poVar8 = std::operator<<((ostream *)&std::cout,"\nOutput filename: ");
    std::__cxx11::stringstream::str();
    poVar8 = std::operator<<(poVar8,local_1d00);
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_1d00);
    poVar8 = std::operator<<((ostream *)&std::cout,"\nLoading alist files");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d68,"hx_filename",&local_1d69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1d90,"0",&local_1d91);
    json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                   in_stack_ffffffffffffd8f8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd858);
    pmVar9 = load_alist_cpp((string *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1d28);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::__cxx11::string::~string(local_1d90);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d91);
    std::__cxx11::string::~string(local_1d68);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d69);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    local_1d98 = pmVar9->n_rows;
    local_1d9c = pmVar9->n_cols;
    local_1d08 = pmVar9;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
    if (bVar2) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e28,"lx_filename",&local_1e29);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e50,"0",&local_1e51);
      json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                     in_stack_ffffffffffffd8f8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd858);
      local_1dc8 = load_alist_cpp((string *)in_stack_ffffffffffffd860);
      std::__cxx11::string::~string(local_1de8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      std::__cxx11::string::~string(local_1e50);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e51);
      std::__cxx11::string::~string(local_1e28);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e29);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      local_1e58 = local_1dc8->n_rows;
      local_1e5c = local_1dc8->n_cols;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<int_&,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd870._M_current,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd868._M_current);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<int_&,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd870._M_current,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd868._M_current);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
    }
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
    if (bVar2) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(in_stack_ffffffffffffd8a0,in_stack_ffffffffffffd898);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1ee8,"hz_filename",&local_1ee9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1f10,"0",&local_1f11);
      json_read_safe((json *)in_stack_ffffffffffffd908,in_stack_ffffffffffffd900,
                     in_stack_ffffffffffffd8f8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::
      operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd858);
      local_1e88 = load_alist_cpp((string *)in_stack_ffffffffffffd860);
      std::__cxx11::string::~string(local_1ea8);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      std::__cxx11::string::~string(local_1f10);
      std::allocator<char>::~allocator((allocator<char> *)&local_1f11);
      std::__cxx11::string::~string(local_1ee8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1ee9);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      local_1f18 = local_1e88->n_rows;
      local_1f1c = local_1e88->n_cols;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<int_&,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd870._M_current,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd868._M_current);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json<int_&,_int,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
      nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd870._M_current,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd868._M_current);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd860);
    }
    bp_osd::bp_osd(in_stack_ffffffffffffd910,in_stack_ffffffffffffd908,
                   (double)in_stack_ffffffffffffd900,(int)((ulong)in_stack_ffffffffffffd8f8 >> 0x20)
                   ,in_stack_ffffffffffffd8f0,(int)((ulong)in_stack_ffffffffffffd8e8 >> 0x20),
                   (int)in_stack_ffffffffffffd8e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<int_&,_int,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(int *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::basic_json<unsigned_long_&,_unsigned_long,_0>
              ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)in_stack_ffffffffffffd860,(unsigned_long *)in_stack_ffffffffffffd858);
    nlohmann::
    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
    ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd870._M_current,
                (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)in_stack_ffffffffffffd868._M_current);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)local_1d9c;
    uVar10 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar10 = 0xffffffffffffffff;
    }
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    uVar10 = (ulong)local_1d9c;
    local_1fe0 = pvVar11;
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    uVar10 = (ulong)local_1d9c;
    local_1fe8 = pvVar11;
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    uVar10 = (ulong)local_1d9c;
    local_1ff0 = pvVar11;
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    uVar10 = (ulong)local_1d9c;
    local_1ff8 = pvVar11;
    __s = (char *)operator_new__(uVar10);
    memset(__s,0,uVar10);
    uVar10 = (ulong)local_1d98;
    local_2000 = __s;
    pvVar11 = operator_new__(uVar10);
    memset(pvVar11,0,uVar10);
    local_2010 = 0;
    local_2018 = 0;
    local_2020 = 0;
    local_2028 = 0;
    local_2008 = pvVar11;
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    poVar8 = std::operator<<((ostream *)&std::cout,"Simulating ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_18a8);
    poVar8 = std::operator<<(poVar8," error correction cycles...");
    std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
    for (local_2050 = 1; local_2050 <= local_18a8; local_2050 = local_2050 + 1) {
      local_202a = 1;
      for (local_2054 = 0; local_2054 < local_1d9c; local_2054 = local_2054 + 1) {
        dVar13 = genRand((MTRand *)0x1482d5);
        *(bool *)((long)local_1fe8 + (long)local_2054) = dVar13 < local_1750;
        if (*(char *)((long)local_1fe8 + (long)local_2054) == '\x01') {
          local_202a = 0;
        }
      }
      if ((local_202a & 1) == 0) {
        syndrome((mod2sparse *)in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858,
                 (char *)0x1483fe);
        local_2000 = bp_osd::bp_osd_decode
                               (in_stack_ffffffffffffd888,(char *)in_stack_ffffffffffffd880);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
        if (bVar2) {
          iVar3 = check_logical_error_lx
                            (in_stack_ffffffffffffd880,(char *)in_stack_ffffffffffffd878,
                             in_stack_ffffffffffffd870._M_current);
        }
        else {
          iVar3 = check_logical_error_hz
                            (in_stack_ffffffffffffd890,(char *)in_stack_ffffffffffffd888,
                             (char *)in_stack_ffffffffffffd880);
        }
        local_2029 = iVar3 != 0;
        if (!local_2029) {
          local_2028 = local_2028 + 1;
        }
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
        if (bVar2) {
          iVar3 = check_logical_error_lx
                            (in_stack_ffffffffffffd880,(char *)in_stack_ffffffffffffd878,
                             in_stack_ffffffffffffd870._M_current);
        }
        else {
          iVar3 = check_logical_error_hz
                            (in_stack_ffffffffffffd890,(char *)in_stack_ffffffffffffd888,
                             (char *)in_stack_ffffffffffffd880);
        }
        local_2029 = iVar3 != 0;
        if (!local_2029) {
          local_2020 = local_2020 + 1;
        }
        if (*local_1f80 == 1) {
          local_2010 = local_2010 + 1;
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffd860,(char *)in_stack_ffffffffffffd858);
          if (bVar2) {
            iVar3 = check_logical_error_lx
                              (in_stack_ffffffffffffd880,(char *)in_stack_ffffffffffffd878,
                               in_stack_ffffffffffffd870._M_current);
          }
          else {
            iVar3 = check_logical_error_hz
                              (in_stack_ffffffffffffd890,(char *)in_stack_ffffffffffffd888,
                               (char *)in_stack_ffffffffffffd880);
          }
          local_2029 = iVar3 != 0;
          if (!local_2029) {
            local_2018 = local_2018 + 1;
          }
        }
      }
      else {
        local_2018 = local_2018 + 1;
        local_2020 = local_2020 + 1;
        local_2028 = local_2028 + 1;
      }
      dVar13 = timing::elapsed_time_seconds((timing *)in_stack_ffffffffffffd870._M_current);
      if (3.0 < dVar13 - (double)local_b4 || local_2050 == local_18a8) {
        auVar18._8_4_ = (int)((ulong)local_2028 >> 0x20);
        auVar18._0_8_ = local_2028;
        auVar18._12_4_ = 0x45300000;
        uVar15 = (undefined4)(local_2050 >> 0x20);
        auVar14._8_4_ = uVar15;
        auVar14._0_8_ = local_2050;
        auVar14._12_4_ = 0x45300000;
        uVar12 = (undefined4)local_2050;
        local_2038 = 1.0 - ((auVar18._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_2028) - 4503599627370496.0)) /
                           ((auVar14._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0));
        auVar19._8_4_ = (int)((ulong)local_2020 >> 0x20);
        auVar19._0_8_ = local_2020;
        auVar19._12_4_ = 0x45300000;
        auVar16._8_4_ = uVar15;
        auVar16._0_8_ = local_2050;
        auVar16._12_4_ = 0x45300000;
        local_2040 = 1.0 - ((auVar19._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_2020) - 4503599627370496.0)) /
                           ((auVar16._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0));
        auVar17._8_4_ = (int)((ulong)local_2018 >> 0x20);
        auVar17._0_8_ = local_2018;
        auVar17._12_4_ = 0x45300000;
        auVar20._8_4_ = uVar15;
        auVar20._0_8_ = local_2050;
        auVar20._12_4_ = 0x45300000;
        local_2048 = 1.0 - ((auVar17._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_2018) - 4503599627370496.0)) /
                           ((auVar20._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,uVar12) - 4503599627370496.0));
        dVar13 = timing::elapsed_time_seconds((timing *)in_stack_ffffffffffffd870._M_current);
        local_b4 = (int)dVar13;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<unsigned_long_long_&,_unsigned_long_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(unsigned_long_long *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<unsigned_long_long_&,_unsigned_long_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(unsigned_long_long *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<unsigned_long_long_&,_unsigned_long_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(unsigned_long_long *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<unsigned_long_long_&,_unsigned_long_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(unsigned_long_long *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        in_stack_ffffffffffffd918 = local_2098;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<unsigned_long_long_&,_unsigned_long_long,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(unsigned_long_long *)in_stack_ffffffffffffd858);
        in_stack_ffffffffffffd920 =
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<double_&,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(double *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<double_&,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(double *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<double_&,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(double *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        local_20f0 = timing::elapsed_time_seconds((timing *)in_stack_ffffffffffffd870._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<double,_double,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(double *)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        local_2108 = timing::elapsed_time_readable(in_stack_ffffffffffffd870._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json<char_*,_char_*,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)in_stack_ffffffffffffd860,(char **)in_stack_ffffffffffffd858);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd870._M_current,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)in_stack_ffffffffffffd868._M_current);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)in_stack_ffffffffffffd860);
        poVar8 = std::operator<<((ostream *)&std::cout,"Runs: ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_2050);
        poVar8 = std::operator<<(poVar8,"; OSDW_LER: ");
        in_stack_ffffffffffffd890 = (mod2sparse *)std::ostream::operator<<(poVar8,local_2038);
        in_stack_ffffffffffffd888 =
             (bp_osd *)std::operator<<((ostream *)in_stack_ffffffffffffd890,"; OSD0_LER: ");
        in_stack_ffffffffffffd880 =
             (mod2sparse *)std::ostream::operator<<(in_stack_ffffffffffffd888,local_2040);
        in_stack_ffffffffffffd878 =
             std::operator<<((ostream *)in_stack_ffffffffffffd880,"; BP_LER: ");
        in_stack_ffffffffffffd870._M_current =
             (char *)std::ostream::operator<<(in_stack_ffffffffffffd878,local_2048);
        in_stack_ffffffffffffd868._M_current =
             (char *)std::operator<<((ostream *)in_stack_ffffffffffffd870._M_current,"; Runtime: ");
        in_stack_ffffffffffffd860 =
             (timing *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>(in_stack_ffffffffffffd920,in_stack_ffffffffffffd918);
        in_stack_ffffffffffffd858 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             nlohmann::operator<<(poVar4,j);
        std::ostream::operator<<(in_stack_ffffffffffffd858,std::endl<char,std::char_traits<char>>);
        std::__cxx11::stringstream::str();
        std::ofstream::ofstream(local_2308,local_2328,_S_trunc);
        std::__cxx11::string::~string(local_2328);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(j,(int)((ulong)poVar6 >> 0x20),(char)((ulong)poVar6 >> 0x18),
               SUB81((ulong)poVar6 >> 0x10,0),(error_handler_t)((ulong)poVar7 >> 0x20));
        std::operator<<(local_2308,local_2348);
        std::__cxx11::string::~string(local_2348);
        std::ofstream::close();
        std::ofstream::~ofstream(local_2308);
      }
    }
    std::__cxx11::stringstream::~stringstream(local_1ce0);
    std::__cxx11::string::~string(local_1b58);
    std::__cxx11::string::~string((string *)local_1b20);
    std::__cxx11::string::~string(local_1a80);
    std::__cxx11::string::~string(local_19c8);
    std::__cxx11::string::~string(local_1938);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)in_stack_ffffffffffffd860);
    std::ifstream::~ifstream(local_2c0);
    return local_4;
  }
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "ERROR: Please provide a location for the output directory");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  exit(0x16);
}

Assistant:

int main(int argc, char *argv[])
{

    if(argv[1]==nullptr){
        cout<<"ERROR: Please provide a location for the input directory"<<endl;
        exit(22);
    };

    if(argv[2]==nullptr){
        cout<<"ERROR: Please provide a location for the output directory"<<endl;
        exit(22);
    };

//    if(argv[3]==nullptr){
//        cout<<"ERROR: Please select a method for verifying the recovered error"<<endl;
//        exit(22);
//    } else if ( strcmp(argv[3],"-lx") != 0 && strcmp(argv[3],"-hz") != 0  ) {
//        cout<<"ERROR: Please select a valid method for verifying the recovered error"<<endl;
//        exit(22);
//    };

    //timing functions setup
    timing time;
    cout<<"Start time: "<<time.start_time_string<<endl;
    cout<<"Input file: "<<argv[1]<<endl;
    int elapsed_seconds;
    elapsed_seconds=time.elapsed_time_seconds();

    //read in json input file
    ifstream json_input_file(argv[1]);
    json json_input;
    json_input_file>>json_input;
    cout<<json_input.dump(1)<<endl;
    json output=json_input;

    //get input file from command line arguments
    output["input_file"]=argv[1];

    //setup random number generator
    int random_seed = json_read_safe(output,"input_seed");
    MTRand r=setup_mtwister_rng(random_seed);

    //save start time
    output["start_time"] = time.start_time_string;

    //generate UI from start time + random seed
    unsigned long long int ui =time.start_time_seconds+random_seed;
    output["ui"]=ui;

    //read in sim parameters
    double bit_error_rate=json_read_safe(json_input,"bit_error_rate");
    int osd_order = json_read_safe(json_input,"osd_order");
    int max_iter=json_read_safe(json_input,"max_iter");
    long long unsigned int target_runs=json_read_safe(json_input,"target_runs");

    //read in Logical check method
    string logical_check_method = json_read_safe(json_input,"logical_check_method","lx");
    if((logical_check_method=="lx")||(logical_check_method=="hz")) 1;
    else{
        cout<<"ERROR: Please select a valid method for verifying the recovered error. `lx' or `hz'."<<endl;
        exit(22);
    }

    //read in OSD method and check that it is valid
    string osd_method = json_read_safe(json_input,"osd_method");
    int osd_method_i=-1;
    if((osd_method=="exhaustive")||(osd_method=="osd_e")) osd_method_i=0;
    else if((osd_method=="combination_sweep")||(osd_method=="osd_cs")) osd_method_i=1;
    else if(osd_method=="osd_0"){
        osd_method_i=2;
        output["osd_order"]=0;
    }
    else if(osd_method=="osd_g") osd_method_i=3;
    else{
        cout<<"ERROR: Invalid OSD method: "<<osd_method<<endl;
        exit(22);
    }
    if(osd_order==0){
        osd_method="osd_0";
        output["osd_method"]=osd_method;
        osd_method_i=2;
    }

    //read in BP method and check that it is valid
    string bp_method = json_read_safe(json_input,"bp_method","min_sum");
    int bp_method_i=-1;
    if(bp_method=="min_sum") bp_method_i=0;
    else if(bp_method=="min_sum_min_synd") bp_method_i=1;
    else if(bp_method=="product_sum") bp_method_i=2;
    else if(bp_method=="product_sum_min_synd") bp_method_i=3;
    else{
        cout<<"ERROR: Invalid BP method: "<<bp_method<<endl;
        exit(22);
    }
    output["bp_method"]=bp_method;

    

    //set up output file
    string p_label =to_string(bit_error_rate);
    replace( p_label.begin(), p_label.end(), '.', '_');
    string label =output["code_label"];
    stringstream output_filename;
    output_filename<<argv[2]<<"/"<<label<<";p:"<<p_label<<";ui:"<<ui<<".json";
    cout<<"\nOutput filename: "<< output_filename.str() <<endl;


    //LOAD ALIST FILES
    cout<<"\nLoading alist files"<<endl;

    //load hx parity check matrix
    mod2sparse *hx=load_alist_cpp(json_read_safe(json_input,"hx_filename"));
    int hx_m=mod2sparse_rows(hx);
    int hx_n=mod2sparse_cols(hx);
    output["hx_n"]=hx_n;
    output["hx_m"]=hx_m;

    //load logical check matrix, lx
    mod2sparse *lx;
    if(logical_check_method=="lx") {
        lx = load_alist_cpp(json_read_safe(json_input, "lx_filename"));
        int lx_k = mod2sparse_rows(lx);
        int lx_n = mod2sparse_cols(lx);
        output["lx_n"] = lx_n;
        output["lx_k"] = lx_k;
        assert(lx_n == hx_n);
    }

    mod2sparse *hz;
    if(logical_check_method=="hz") {
        hz=load_alist_cpp(json_read_safe(json_input,"hz_filename"));
        int hz_m=mod2sparse_rows(hz);
        int hz_n=mod2sparse_cols(hz);
        output["hz_n"]=hz_n;
        output["hz_m"]=hz_m;
        assert(hz_n==hx_n);
    }


    //Setup BP+OSD decoder for hx
    bp_osd hx_bp_osd(hx,bit_error_rate,max_iter,osd_order,osd_method_i,bp_method_i);
    output["max_iter"]=hx_bp_osd.max_iter;
    output["osdw_encoding_operator_count"]=hx_bp_osd.encoding_input_count;


    //MEMORY ALLOCATION (we can do this now that we know the size of the matrices we are dealing with!)
    double *soft_decisions = new double[hx_n]();
    char *bit_error = new char[hx_n]();
    char *bp_decoding = new char[hx_n]();
    char *osd_decoding = new char[hx_n]();
    char *osdw_decoding = new char[hx_n]();
    char *bit_syndrome = new char[hx_m]();

    //declarations for various simulation variables
    long long unsigned int bp_converge_count=0;
    long long unsigned int bp_success_count=0;
    long long unsigned int osd0_success_count=0;
    long long unsigned int osdw_success_count=0;
    bool logical_error;
    bool zero_error;
    double osdw_ler;
    double osd0_ler;
    double bp_ler;



    //MAIN SIM LOOP

    cout<<endl;
    cout<<"Simulating "<<target_runs<<" error correction cycles..."<<endl;
    for(long long unsigned int run_count=1; run_count <= target_runs; run_count++) {

        //generate error
        zero_error=true;
        for (int bit_no = 0; bit_no < hx_n; bit_no++) {
            bit_error[bit_no] = genRand(&r) < bit_error_rate;
            if(bit_error[bit_no]==1) zero_error=false;
        }

        //Skip decoding if generated error is a zero vector.
        if(zero_error) {
            bp_success_count++;
            osd0_success_count++;
            osdw_success_count++;
        }
        else {
            //calculate syndrome
            syndrome(hx, bit_error, bit_syndrome);

            //decode
            osdw_decoding = hx_bp_osd.bp_osd_decode(bit_syndrome);


            //check for logical errors
            if (logical_check_method=="lx") {
                logical_error = check_logical_error_lx(lx, bit_error, osdw_decoding);
            } else {
                logical_error = check_logical_error_hz(hz, bit_error, osdw_decoding);
            }

            if (!logical_error) osdw_success_count++;
            
//            osdw_decoding = hx_bp_osd.osd0_decoding;
            if (logical_check_method=="lx") {
                logical_error = check_logical_error_lx(lx, bit_error, hx_bp_osd.osd0_decoding);
            } else {
                logical_error = check_logical_error_hz(hz, bit_error, hx_bp_osd.osd0_decoding);
            }
            
            if (!logical_error) osd0_success_count++;

            if (*hx_bp_osd.converge == 1) {
                bp_converge_count++;

                if (logical_check_method=="lx") {
                    logical_error = check_logical_error_lx(lx, bit_error, hx_bp_osd.bp_decoding);
                } else {
                    logical_error = check_logical_error_hz(hz, bit_error, hx_bp_osd.bp_decoding);
                }

                if (!logical_error) bp_success_count++;
            }
        }


        //write to output every 3 seconds. Change this as you see fit
        if((time.elapsed_time_seconds()-elapsed_seconds>3) | (run_count==target_runs) ){

            //calculate logical error rates
            osdw_ler= 1.0 - osdw_success_count / (double(run_count));
            osd0_ler= 1.0 - osd0_success_count / (double(run_count));
            bp_ler= 1.0 - bp_success_count / (double(run_count));

            elapsed_seconds=time.elapsed_time_seconds();

            output["run_count"] = run_count;
            output["osdw_success_count"]=osdw_success_count;
            output["osd0_success_count"]=osd0_success_count;
            output["bp_success_count"]=bp_success_count;
            output["bp_converge_count"]=bp_converge_count;
            output["osdw_ler"] = osdw_ler;
            output["osd0_ler"] = osd0_ler;
            output["bp_ler"] = bp_ler;
            output["runtime_seconds"] = time.elapsed_time_seconds();
            output["runtime_readable"] = time.elapsed_time_readable();
            cout << "Runs: " << run_count << "; OSDW_LER: " << osdw_ler << "; OSD0_LER: " << osd0_ler << "; BP_LER: " << bp_ler << "; Runtime: " << output["runtime_readable"] << endl;

            //command line output
            ofstream output_file(output_filename.str(),ofstream::trunc);
            output_file<<output.dump(1);
            output_file.close();

        }





    }



}